

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * lj_alloc_realloc(void *msp,void *ptr,size_t nsize)

{
  byte *pbVar1;
  int iVar2;
  ulong *puVar3;
  int *piVar4;
  void *pvVar5;
  size_t newtopsize;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  
  if (0xffffffffffffff7f < nsize) {
    return (void *)0x0;
  }
  puVar10 = (ulong *)((long)ptr + -0x10);
  uVar8 = *(ulong *)((long)ptr + -8);
  uVar9 = uVar8 & 0xfffffffffffffffc;
  uVar11 = 0x20;
  if (0x16 < nsize) {
    uVar11 = nsize + 0xf & 0xfffffffffffffff8;
  }
  puVar3 = puVar10;
  if (((uVar8 & 1) == 0) && ((*puVar10 & 1) != 0)) {
    if (0xff < uVar11) {
      uVar8 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffffc;
      if (uVar8 < uVar11 + 8 || 0x10000 < uVar8 - uVar11) {
        uVar6 = *puVar10 & 0xfffffffffffffffe;
        uVar11 = uVar11 + 0x1036 & 0xfffffffffffff000;
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        puVar3 = (ulong *)0x0;
        pvVar5 = mremap((void *)((long)puVar10 - uVar6),uVar8 + uVar6 + 0x20,uVar11,1);
        *piVar4 = iVar2;
        if (pvVar5 != (void *)0xffffffffffffffff) {
          puVar3 = (ulong *)((long)pvVar5 + uVar6);
          *(ulong *)((long)pvVar5 + uVar6 + 8) = (uVar11 - uVar6) - 0x20 | 2;
          pbVar1 = (byte *)((uVar11 - uVar6) + -0x18 + (long)puVar3);
          pbVar1[0] = 0xb;
          pbVar1[1] = 0;
          pbVar1[2] = 0;
          pbVar1[3] = 0;
          pbVar1[4] = 0;
          pbVar1[5] = 0;
          pbVar1[6] = 0;
          pbVar1[7] = 0;
          *(undefined8 *)((long)pvVar5 + (uVar11 - 0x10)) = 0;
        }
      }
      goto LAB_0011feb0;
    }
  }
  else {
    uVar8 = (ulong)((uint)uVar8 & 1);
    if (uVar11 <= uVar9) {
      if (0x1f < uVar9 - uVar11) {
        *(ulong *)((long)ptr + -8) = uVar8 + uVar11 + 2;
        *(ulong *)((long)ptr + (uVar11 - 8)) = uVar9 - uVar11 | 3;
        pbVar1 = (byte *)((long)ptr + (uVar9 - 8));
        *pbVar1 = *pbVar1 | 1;
        lj_alloc_free(msp,(byte *)((long)puVar10 + uVar11 + 0x10));
      }
      goto LAB_0011feb0;
    }
    if (((long)ptr + (uVar9 - 0x10) == *(long *)((long)msp + 0x20)) &&
       (uVar6 = *(long *)((long)msp + 0x10) + uVar9, uVar7 = uVar6 - uVar11,
       uVar11 <= uVar6 && uVar7 != 0)) {
      *(ulong *)((long)ptr + -8) = uVar8 + uVar11 + 2;
      *(ulong *)((long)ptr + (uVar11 - 8)) = uVar7 | 1;
      *(byte **)((long)msp + 0x20) = (byte *)((long)puVar10 + uVar11);
      *(ulong *)((long)msp + 0x10) = uVar7;
      goto LAB_0011feb0;
    }
  }
  puVar3 = (ulong *)0x0;
LAB_0011feb0:
  if (puVar3 == (ulong *)0x0) {
    puVar3 = (ulong *)lj_alloc_malloc(msp,nsize);
    if (puVar3 != (ulong *)0x0) {
      uVar8 = 0xfffffffffffffff8;
      if ((*(byte *)((long)ptr + -8) & 1) == 0) {
        uVar8 = (ulong)((*(byte *)puVar10 & 1) == 0) << 3 | 0xfffffffffffffff0;
      }
      uVar11 = uVar8 + uVar9;
      if (nsize <= uVar8 + uVar9) {
        uVar11 = nsize;
      }
      memcpy(puVar3,ptr,uVar11);
      lj_alloc_free(msp,ptr);
    }
  }
  else {
    puVar3 = puVar3 + 2;
  }
  return puVar3;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_realloc(void *msp, void *ptr, size_t nsize)
{
  if (nsize >= MAX_REQUEST) {
    return NULL;
  } else {
    mstate m = (mstate)msp;
    mchunkptr oldp = mem2chunk(ptr);
    size_t oldsize = chunksize(oldp);
    mchunkptr next = chunk_plus_offset(oldp, oldsize);
    mchunkptr newp = 0;
    size_t nb = request2size(nsize);

    /* Try to either shrink or extend into top. Else malloc-copy-free */
    if (is_direct(oldp)) {
      newp = direct_resize(oldp, nb);  /* this may return NULL. */
    } else if (oldsize >= nb) { /* already big enough */
      size_t rsize = oldsize - nb;
      newp = oldp;
      if (rsize >= MIN_CHUNK_SIZE) {
	mchunkptr rem = chunk_plus_offset(newp, nb);
	set_inuse(m, newp, nb);
	set_inuse(m, rem, rsize);
	lj_alloc_free(m, chunk2mem(rem));
      }
    } else if (next == m->top && oldsize + m->topsize > nb) {
      /* Expand into top */
      size_t newsize = oldsize + m->topsize;
      size_t newtopsize = newsize - nb;
      mchunkptr newtop = chunk_plus_offset(oldp, nb);
      set_inuse(m, oldp, nb);
      newtop->head = newtopsize |PINUSE_BIT;
      m->top = newtop;
      m->topsize = newtopsize;
      newp = oldp;
    }

    if (newp != 0) {
      return chunk2mem(newp);
    } else {
      void *newmem = lj_alloc_malloc(m, nsize);
      if (newmem != 0) {
	size_t oc = oldsize - overhead_for(oldp);
	memcpy(newmem, ptr, oc < nsize ? oc : nsize);
	lj_alloc_free(m, ptr);
      }
      return newmem;
    }
  }
}